

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

int __thiscall Parse::simpleExpression(Parse *this)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Type TVar3;
  Type TVar4;
  pointer pvVar5;
  long lVar6;
  SymbolTable *pSVar7;
  pointer piVar8;
  uint __val;
  uint uVar9;
  int iVar10;
  int iVar11;
  long *plVar12;
  ostream *poVar13;
  uint uVar14;
  size_type *psVar15;
  ulong uVar16;
  Parse *this_00;
  char *this_01;
  uint uVar17;
  long lVar18;
  uint __len;
  Type helper_Type;
  string helper;
  Type local_cc;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  SymbolTableElement local_88;
  
  iVar11 = this->curIndex;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  iVar10 = additiveExpression(this);
  if (iVar10 == 0) {
    this->curIndex = iVar11;
    iVar11 = 0;
  }
  else {
    this_00 = (Parse *)&this->relopTmp;
    std::__cxx11::string::_M_assign((string *)&local_a8);
    TVar3 = this->relopType;
    local_cc = TVar3;
    iVar11 = relop(this);
    if (iVar11 != 0) {
      iVar11 = additiveExpression(this);
      if (iVar11 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,anon_var_dwarf_340e0 + 9,0xf);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
LAB_0010e4af:
        exit(0);
      }
      TVar4 = this->relopType;
      if (((TVar4 < ARRAY) && ((0x16U >> (TVar4 & 0x1f) & 1) != 0)) && (TVar3 == CHAR)) {
        toSymTypeName_abi_cxx11_(&local_88.name,this_00,&local_cc);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_88.name._M_dataplus._M_p,
                             local_88.name._M_string_length);
        this_01 = anon_var_dwarf_340ac;
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,anon_var_dwarf_340ac,0xf);
        toSymTypeName_abi_cxx11_(&local_c8,(Parse *)this_01,&this->relopType);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,local_c8._M_dataplus._M_p,local_c8._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar13);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_88);
        goto LAB_0010e4af;
      }
      uVar17 = this->t_num + 1;
      this->t_num = uVar17;
      __val = -uVar17;
      if (0 < (int)uVar17) {
        __val = uVar17;
      }
      __len = 1;
      if (9 < __val) {
        uVar16 = (ulong)__val;
        uVar9 = 4;
        do {
          __len = uVar9;
          uVar14 = (uint)uVar16;
          if (uVar14 < 100) {
            __len = __len - 2;
            goto LAB_0010e24a;
          }
          if (uVar14 < 1000) {
            __len = __len - 1;
            goto LAB_0010e24a;
          }
          if (uVar14 < 10000) goto LAB_0010e24a;
          uVar16 = uVar16 / 10000;
          uVar9 = __len + 4;
        } while (99999 < uVar14);
        __len = __len + 1;
      }
LAB_0010e24a:
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_c8,(char)__len - (char)((int)uVar17 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_c8._M_dataplus._M_p + (uVar17 >> 0x1f),__len,__val);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x12c557);
      paVar2 = &local_88.name.field_2;
      psVar15 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_88.name.field_2._M_allocated_capacity = *psVar15;
        local_88.name.field_2._8_8_ = plVar12[3];
        local_88.name._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_88.name.field_2._M_allocated_capacity = *psVar15;
        local_88.name._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_88.name._M_string_length = plVar12[1];
      *plVar12 = (long)psVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::operator=((string *)&this->curTmpName,(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.name._M_dataplus._M_p != paVar2) {
        operator_delete(local_88.name._M_dataplus._M_p,
                        local_88.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      std::vector<QuadTuple,std::allocator<QuadTuple>>::
      emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,&this->relopName,
                 &local_a8,&this->relopTmp,&this->curTmpName);
      local_88.name.field_2._8_8_ = 0;
      local_88.pfinalind = 0;
      local_88._60_4_ = 0;
      local_88.constNum = 0.0;
      local_88.type = 0;
      local_88.cat = 0;
      local_88.ctInd = 0;
      local_88.len = 0;
      local_88.name._M_string_length = 0;
      local_88.name.field_2._M_allocated_capacity = 0;
      local_88.aiInd = 0;
      local_88.vall = 0;
      local_88.isTemp = false;
      local_88.isActive = true;
      local_88._74_6_ = 0;
      local_88.name._M_dataplus._M_p = (pointer)paVar2;
      std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::
      emplace_back<SymbolTableElement>
                ((this->st->symbolTable).
                 super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + this->curFun,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.name._M_dataplus._M_p != paVar2) {
        operator_delete(local_88.name._M_dataplus._M_p,
                        local_88.name.field_2._M_allocated_capacity + 1);
      }
      pvVar5 = (this->st->symbolTable).
               super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = *(long *)&pvVar5[this->curFun].
                        super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>.
                        _M_impl.super__Vector_impl_data;
      lVar18 = (((long)*(pointer *)
                        ((long)&pvVar5[this->curFun].
                                super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>
                                ._M_impl.super__Vector_impl_data + 8) - lVar6 >> 4) *
                -0x3333333333333333 + -1) * 0x50;
      std::__cxx11::string::_M_assign((string *)(lVar6 + lVar18));
      pSVar7 = this->st;
      iVar11 = this->curFun;
      lVar6 = *(long *)&(pSVar7->symbolTable).
                        super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar11].
                        super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>.
                        _M_impl.super__Vector_impl_data;
      *(undefined8 *)(lVar6 + 0x20 + lVar18) = 0x200000004;
      *(undefined2 *)(lVar6 + 0x48 + lVar18) = 1;
      piVar8 = (pSVar7->vallVec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(int *)(lVar6 + 0x34 + lVar18) = piVar8[iVar11];
      piVar1 = piVar8 + iVar11;
      *piVar1 = *piVar1 + 1;
      std::__cxx11::string::_M_assign((string *)&this->expName);
    }
    std::__cxx11::string::_M_assign((string *)&this->simExpName);
    this->simExpType = this->relopType;
    iVar11 = 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  return iVar11;
}

Assistant:

int Parse::simpleExpression() {
    int index = curIndex;
    string helper;
    Type helper_Type;
    if(additiveExpression()) {
        helper = relopTmp;
        helper_Type = relopType;
        if(relop()) {
            if (additiveExpression()) {
                if(!typePriority(relopType, helper_Type)) {
//                    cout << helper_Type << " " << relopType << endl;
                    cout << toSymTypeName(helper_Type) <<"类型不匹配" << toSymTypeName(relopType)<< endl;
                    exit(0);
                }
                curTmpName = "t" + to_string(++t_num);
                quadVec.emplace_back(relopName, helper, relopTmp, curTmpName);
                st.symbolTable[curFun].push_back(SymbolTableElement());
                auto symInd = st.symbolTable[curFun].size() - 1;
                st.symbolTable[curFun][symInd].name = curTmpName;
                st.symbolTable[curFun][symInd].type = Type::BOOL;
                st.symbolTable[curFun][symInd].cat = Category ::CONST;
                st.symbolTable[curFun][symInd].isTemp = true;
                st.symbolTable[curFun][symInd].isActive = false;
                st.symbolTable[curFun][symInd].vall = st.vallVec[curFun];
                st.vallVec[curFun] += 1;
                expName = curTmpName;
            } else {
                cout << "表达式错误" << endl;
                exit(0);
            }
        }
        simExpName = relopTmp;
        simExpType = relopType;
        return 1;
    }
    curIndex = index;
    return 0;
}